

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

void Sbd_ManMatrPrint(Sbd_Man_t *p,word *Cover,int nCol,int nRows)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (-1 < nCol) {
    uVar3 = 0;
    do {
      printf("%2d : ",uVar3 & 0xffffffff);
      if (uVar3 == (uint)nCol) {
        uVar2 = p->Pivot;
      }
      else {
        if ((long)p->vDivVars->nSize <= (long)uVar3) goto LAB_0053c5d7;
        iVar1 = p->vDivVars->pArray[uVar3];
        if (((long)iVar1 < 0) || (p->vWinObjs->nSize <= iVar1)) goto LAB_0053c5d7;
        uVar2 = p->vWinObjs->pArray[iVar1];
      }
      if (((int)uVar2 < 0) || (p->vLutLevs->nSize <= (int)uVar2)) {
LAB_0053c5d7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      printf("%d ",(ulong)(uint)p->vLutLevs->pArray[uVar2]);
      if (0 < nRows) {
        uVar4 = 0;
        do {
          printf("%d",(ulong)((Cover[uVar3] >> (uVar4 & 0x3f) & 1) != 0));
          uVar4 = uVar4 + 1;
        } while ((uint)nRows != uVar4);
      }
      putchar(10);
      uVar3 = uVar3 + 1;
    } while (uVar3 != nCol + 1);
  }
  putchar(10);
  return;
}

Assistant:

void Sbd_ManMatrPrint( Sbd_Man_t * p, word Cover[], int nCol, int nRows )
{
    int i, k;
    for ( i = 0; i <= nCol; i++ )
    {
        printf( "%2d : ", i );
        printf( "%d ", i == nCol ? Vec_IntEntry(p->vLutLevs, p->Pivot) : Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Vec_IntEntry(p->vDivVars, i))) );
        for ( k = 0; k < nRows; k++ )
            printf( "%d", (int)((Cover[i] >> k) & 1) );
        printf( "\n"); 
    }
    printf( "\n");
}